

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint16 crnd::dxt1_block::pack_color(uint32 r,uint32 g,uint32 b,bool scaled,uint32 bias)

{
  uint16 uVar1;
  color_quad<unsigned_char,_int> local_20;
  uint32 local_1c;
  byte local_15;
  uint32 bias_local;
  uint32 uStack_10;
  bool scaled_local;
  uint32 b_local;
  uint32 g_local;
  uint32 r_local;
  
  local_1c = bias;
  local_15 = scaled;
  bias_local = b;
  uStack_10 = g;
  b_local = r;
  color_quad<unsigned_char,_int>::color_quad(&local_20,r,g,b,0);
  uVar1 = pack_color(&local_20,(bool)(local_15 & 1),local_1c);
  return uVar1;
}

Assistant:

uint16 dxt1_block::pack_color(uint32 r, uint32 g, uint32 b, bool scaled, uint32 bias)
    {
        return pack_color(color_quad_u8(r, g, b, 0), scaled, bias);
    }